

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O0

void GEN_CS::call_cs_ldf<true>
               (multi_learner *base,multi_ex *examples,v_array<CB::label> *cb_labels,
               label *cs_labels,v_array<COST_SENSITIVE::label> *prepped_cs_labels,uint64_t offset,
               size_t id)

{
  label *plVar1;
  example *peVar2;
  value_type peVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  label **pplVar7;
  reference ppeVar8;
  reference ppeVar9;
  size_type sVar10;
  label_t *plVar11;
  v_array<COST_SENSITIVE::wclass> *in_RCX;
  v_array<CB::label> *in_RDX;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  v_array<COST_SENSITIVE::label> *in_R8;
  uint64_t in_R9;
  size_t i;
  example *ec;
  iterator __end2;
  iterator __begin2;
  multi_ex *__range2;
  size_t index;
  uint64_t saved_offset;
  size_t in_stack_00000148;
  v_array<COST_SENSITIVE::label> *in_stack_00000150;
  wclass *in_stack_ffffffffffffff58;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffff60;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff68;
  uint64_t uVar12;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_ffffffffffffff70;
  size_t local_68;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_50;
  vector<example_*,_std::allocator<example_*>_> *local_48;
  size_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  v_array<COST_SENSITIVE::label> *local_28;
  v_array<COST_SENSITIVE::wclass> *local_20;
  v_array<CB::label> *local_18;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  v_array<CB::label>::clear((v_array<CB::label> *)in_stack_ffffffffffffff60);
  sVar5 = v_array<COST_SENSITIVE::label>::size(local_28);
  sVar6 = v_array<COST_SENSITIVE::wclass>::size(local_20);
  if (sVar5 < sVar6 + 1) {
    v_array<COST_SENSITIVE::wclass>::size(local_20);
    v_array<COST_SENSITIVE::label>::resize(in_stack_00000150,in_stack_00000148);
    plVar1 = local_28->end_array;
    pplVar7 = v_array<COST_SENSITIVE::label>::end(local_28);
    *pplVar7 = plVar1;
  }
  ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,0);
  local_38 = ((*ppeVar8)->super_example_predict).ft_offset;
  local_40 = 0;
  local_48 = local_10;
  local_50._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin
                 ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffff58);
  std::vector<example_*,_std::allocator<example_*>_>::end
            ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar4) break;
    ppeVar9 = __gnu_cxx::
              __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
              operator*(&local_50);
    peVar2 = *ppeVar9;
    v_array<CB::label>::push_back
              ((v_array<CB::label> *)in_stack_ffffffffffffff60,(label *)in_stack_ffffffffffffff58);
    v_array<COST_SENSITIVE::label>::operator[](local_28,local_40);
    v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffff60);
    v_array<COST_SENSITIVE::label>::operator[](local_28,local_40);
    v_array<COST_SENSITIVE::wclass>::operator[](local_20,local_40);
    v_array<COST_SENSITIVE::wclass>::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    sVar5 = local_40;
    local_40 = local_40 + 1;
    plVar11 = (label_t *)v_array<COST_SENSITIVE::label>::operator[](local_28,sVar5);
    (peVar2->l).multi = *plVar11;
    (peVar2->l).cs.costs._end = (wclass *)plVar11[1];
    (peVar2->l).cs.costs.end_array = (wclass *)plVar11[2];
    (peVar2->l).cs.costs.erase_count = (size_t)plVar11[3];
    (peVar2->super_example_predict).ft_offset = local_30;
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(&local_50);
  }
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
  local_68 = 0;
  while( true ) {
    sVar5 = local_68;
    sVar10 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
    if (sVar10 <= sVar5) break;
    plVar11 = (label_t *)v_array<CB::label>::operator[](local_18,local_68);
    ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_68);
    peVar3 = *ppeVar8;
    (peVar3->l).multi = *plVar11;
    (peVar3->l).cs.costs._end = (wclass *)plVar11[1];
    (peVar3->l).cs.costs.end_array = (wclass *)plVar11[2];
    (peVar3->l).cs.costs.erase_count = (size_t)plVar11[3];
    uVar12 = local_38;
    ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_68);
    ((*ppeVar8)->super_example_predict).ft_offset = uVar12;
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

void call_cs_ldf(LEARNER::multi_learner& base, multi_ex& examples, v_array<CB::label>& cb_labels,
    COST_SENSITIVE::label& cs_labels, v_array<COST_SENSITIVE::label>& prepped_cs_labels, uint64_t offset, size_t id = 0)
{
  cb_labels.clear();
  if (prepped_cs_labels.size() < cs_labels.costs.size() + 1)
  {
    prepped_cs_labels.resize(cs_labels.costs.size() + 1);
    prepped_cs_labels.end() = prepped_cs_labels.end_array;
  }

  // 1st: save cb_label (into mydata) and store cs_label for each example, which will be passed into base.learn.
  // also save offsets
  uint64_t saved_offset = examples[0]->ft_offset;
  size_t index = 0;
  for (auto ec : examples)
  {
    cb_labels.push_back(ec->l.cb);
    prepped_cs_labels[index].costs.clear();
    prepped_cs_labels[index].costs.push_back(cs_labels.costs[index]);
    ec->l.cs = prepped_cs_labels[index++];
    ec->ft_offset = offset;
  }

  // 2nd: predict for each ex
  // // call base.predict for all examples
  if (is_learn)
    base.learn(examples, (int32_t)id);
  else
    base.predict(examples, (int32_t)id);

  // 3rd: restore cb_label for each example
  // (**ec).l.cb = array.element.
  // and restore offsets
  for (size_t i = 0; i < examples.size(); ++i)
  {
    examples[i]->l.cb = cb_labels[i];
    examples[i]->ft_offset = saved_offset;
  }
}